

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall V2Transport::StartSendingHandshake(V2Transport *this)

{
  long lVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __result;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  const_iterator __first;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RDI;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  byte *in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c,(AnnotatedMixin<std::mutex> *)0xffb69a);
  inline_assertion_check<false,bool>
            ((bool *)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(char *)in_stack_ffffffffffffff70,
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(in_stack_ffffffffffffff78);
  inline_assertion_check<false,bool>
            ((bool *)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(char *)in_stack_ffffffffffffff70,
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  __result._M_current = in_RDI._M_current + 0x548;
  __last._M_current = (uchar *)EllSwiftPubKey::size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80);
  BIP324Cipher::GetOurPubKey
            ((BIP324Cipher *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::begin<EllSwiftPubKey>
            ((EllSwiftPubKey *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  BIP324Cipher::GetOurPubKey
            ((BIP324Cipher *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  __first = std::end<EllSwiftPubKey>
                      ((EllSwiftPubKey *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  MakeWritableByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            (in_stack_ffffffffffffff78);
  Span<std::byte>::begin
            ((Span<std::byte> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::copy<std::byte_const*,std::byte*>
            (__first,in_stack_ffffffffffffff80,(byte *)in_stack_ffffffffffffff78);
  this_00 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)(in_RDI._M_current + 0x568);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffff70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff70);
  EllSwiftPubKey::size();
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+(this_00,(difference_type)in_stack_ffffffffffffff70);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (in_RDI,__last,__result);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void V2Transport::StartSendingHandshake() noexcept
{
    AssertLockHeld(m_send_mutex);
    Assume(m_send_state == SendState::AWAITING_KEY);
    Assume(m_send_buffer.empty());
    // Initialize the send buffer with ellswift pubkey + provided garbage.
    m_send_buffer.resize(EllSwiftPubKey::size() + m_send_garbage.size());
    std::copy(std::begin(m_cipher.GetOurPubKey()), std::end(m_cipher.GetOurPubKey()), MakeWritableByteSpan(m_send_buffer).begin());
    std::copy(m_send_garbage.begin(), m_send_garbage.end(), m_send_buffer.begin() + EllSwiftPubKey::size());
    // We cannot wipe m_send_garbage as it will still be used as AAD later in the handshake.
}